

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *
wasm::WATParser::results<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
           *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  _Variant_storage<false,_wasm::Type,_wasm::Err> *this;
  bool bVar1;
  bool bVar2;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *pMVar3;
  string_view expected;
  undefined1 local_c8 [8];
  Result<wasm::Type> type;
  Result<wasm::Type> _val;
  undefined1 auStack_58 [8];
  ResultsT res;
  
  res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bVar2 = false;
  this = (_Variant_storage<false,_wasm::Type,_wasm::Err> *)
         ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20);
  res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)__return_storage_ptr__;
  do {
    expected._M_str = "result";
    expected._M_len = 6;
    bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
    if (!bVar1) {
      pMVar3 = (MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
               res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (bVar2) {
        (res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage)->id = (uintptr_t)auStack_58;
        res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[1].id =
             (uintptr_t)
             res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
        res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[2].id =
             (uintptr_t)
             res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
        auStack_58 = (undefined1  [8])0x0;
        res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined1 *)
         &res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[4].id = 0;
      }
      else {
        *(undefined1 *)
         &res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[4].id = 1;
      }
LAB_00c3cdaa:
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58);
      return pMVar3;
    }
    while( true ) {
      bVar2 = Lexer::takeRParen(&ctx->in);
      if (bVar2) break;
      valtype<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Type> *)local_c8,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)this,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_c8);
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                   (string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        pMVar3 = (MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                 res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        std::__detail::__variant::
        _Variant_storage<false,std::vector<wasm::Type,std::allocator<wasm::Type>>,wasm::None,wasm::Err>
        ::_Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,std::vector<wasm::Type,std::allocator<wasm::Type>>,wasm::None,wasm::Err>
                    *)res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                   (__index_type *)
                   ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_c8);
        goto LAB_00c3cdaa;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                (this);
      TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::appendResult
                (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                 (ResultsT *)auStack_58,(TypeT)local_c8);
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_c8);
    }
    bVar2 = true;
  } while( true );
}

Assistant:

MaybeResult<typename Ctx::ResultsT> results(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeResults();
  while (ctx.in.takeSExprStart("result"sv)) {
    hasAny = true;
    while (!ctx.in.takeRParen()) {
      auto type = valtype(ctx);
      CHECK_ERR(type);
      ctx.appendResult(res, *type);
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}